

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas2.c
# Opt level: O3

int sp_dgemv(char *trans,double alpha,SuperMatrix *A,double *x,int incx,double beta,double *y,
            int incy)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  double *pdVar13;
  ulong uVar14;
  long lVar15;
  undefined8 uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  char msg [256];
  int local_138 [66];
  
  auVar11 = _DAT_0010f1a0;
  auVar10 = _DAT_0010f190;
  cVar1 = *trans;
  pvVar5 = A->Store;
  lVar6 = *(long *)((long)pvVar5 + 8);
  bVar9 = true;
  if (cVar1 != 'N') {
    if ((cVar1 == 'C') || (cVar1 == 'T')) {
      bVar9 = false;
    }
    else if (cVar1 != 'n') {
      local_138[0] = 1;
      goto LAB_0010de19;
    }
  }
  uVar2 = A->nrow;
  if (-1 < (int)uVar2) {
    uVar3 = A->ncol;
    lVar20 = (long)(int)uVar3;
    if (-1 < lVar20) {
      if (incx == 0) {
        local_138[0] = 5;
      }
      else {
        if (incy != 0) {
          if (uVar3 == 0 || uVar2 == 0) {
            return 0;
          }
          if ((((alpha == 0.0) && (!NAN(alpha))) && (beta == 1.0)) && (!NAN(beta))) {
            return 0;
          }
          uVar12 = uVar2;
          if (cVar1 != 'N') {
            uVar12 = uVar3;
            uVar3 = uVar2;
          }
          iVar19 = (1 - uVar3) * incx;
          if (0 < incx) {
            iVar19 = 0;
          }
          iVar4 = (1 - uVar12) * incy;
          if (0 < incy) {
            iVar4 = 0;
          }
          if ((beta != 1.0) || (NAN(beta))) {
            if (incy == 1) {
              if ((beta != 0.0) || (NAN(beta))) {
                uVar14 = 0;
                do {
                  y[uVar14] = y[uVar14] * beta;
                  uVar14 = uVar14 + 1;
                } while (uVar12 != uVar14);
              }
              else {
                memset(y,0,(ulong)uVar12 << 3);
              }
            }
            else {
              lVar15 = (long)incy;
              if ((beta != 0.0) || (NAN(beta))) {
                pdVar13 = y + iVar4;
                do {
                  *pdVar13 = *pdVar13 * beta;
                  pdVar13 = pdVar13 + lVar15;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
              else {
                uVar12 = uVar12 - 1;
                auVar22._4_4_ = 0;
                auVar22._0_4_ = uVar12;
                auVar22._8_4_ = uVar12;
                auVar22._12_4_ = 0;
                pdVar13 = y + iVar4;
                uVar14 = 0;
                auVar22 = auVar22 ^ _DAT_0010f1a0;
                do {
                  auVar23._8_4_ = (int)uVar14;
                  auVar23._0_8_ = uVar14;
                  auVar23._12_4_ = (int)(uVar14 >> 0x20);
                  auVar23 = (auVar23 | auVar10) ^ auVar11;
                  if ((bool)(~(auVar23._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar23._0_4_ ||
                              auVar22._4_4_ < auVar23._4_4_) & 1)) {
                    *pdVar13 = 0.0;
                  }
                  if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
                      auVar23._12_4_ <= auVar22._12_4_) {
                    pdVar13[lVar15] = 0.0;
                  }
                  uVar14 = uVar14 + 2;
                  pdVar13 = pdVar13 + lVar15 * 2;
                } while (((ulong)uVar12 + 2 & 0xfffffffffffffffe) != uVar14);
              }
            }
          }
          if ((alpha == 0.0) && (!NAN(alpha))) {
            return 0;
          }
          if (bVar9) {
            if (incy == 1) {
              lVar15 = (long)iVar19;
              lVar17 = 0;
              do {
                dVar21 = x[lVar15];
                if ((dVar21 != 0.0) || (NAN(dVar21))) {
                  iVar19 = *(int *)(*(long *)((long)pvVar5 + 0x18) + lVar17 * 4);
                  lVar18 = (long)iVar19;
                  iVar4 = *(int *)(*(long *)((long)pvVar5 + 0x18) + 4 + lVar17 * 4);
                  if (iVar19 < iVar4) {
                    lVar7 = *(long *)((long)pvVar5 + 0x10);
                    do {
                      iVar19 = *(int *)(lVar7 + lVar18 * 4);
                      y[iVar19] = *(double *)(lVar6 + lVar18 * 8) * dVar21 * alpha + y[iVar19];
                      lVar18 = lVar18 + 1;
                    } while (iVar4 != lVar18);
                  }
                }
                lVar15 = lVar15 + incx;
                lVar17 = lVar17 + 1;
              } while (lVar17 != lVar20);
              return 0;
            }
            uVar16 = 0x1ce;
          }
          else {
            if (incx == 1) {
              piVar8 = *(int **)((long)pvVar5 + 0x18);
              lVar15 = (long)iVar4;
              lVar17 = 0;
              iVar19 = *piVar8;
              do {
                iVar4 = piVar8[lVar17 + 1];
                dVar21 = 0.0;
                if (iVar19 < iVar4) {
                  lVar18 = (long)iVar19;
                  do {
                    dVar21 = dVar21 + *(double *)(lVar6 + lVar18 * 8) *
                                      x[*(int *)(*(long *)((long)pvVar5 + 0x10) + lVar18 * 4)];
                    lVar18 = lVar18 + 1;
                  } while (iVar4 != lVar18);
                }
                lVar17 = lVar17 + 1;
                y[lVar15] = dVar21 * alpha + y[lVar15];
                lVar15 = lVar15 + incy;
                iVar19 = iVar4;
              } while (lVar17 != lVar20);
              return 0;
            }
            uVar16 = 0x1de;
          }
          sprintf((char *)local_138,"%s at line %d in file %s\n","Not implemented.",uVar16,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dsp_blas2.c"
                 );
          superlu_abort_and_exit((char *)local_138);
          return 0;
        }
        local_138[0] = 8;
      }
      goto LAB_0010de19;
    }
  }
  local_138[0] = 3;
LAB_0010de19:
  input_error("sp_dgemv ",local_138);
  return 0;
}

Assistant:

int
sp_dgemv(char *trans, double alpha, SuperMatrix *A, double *x, 
	 int incx, double beta, double *y, int incy)
{
    /* Local variables */
    NCformat *Astore;
    double   *Aval;
    int info;
    double temp;
    int lenx, leny;
    int iy, jx, jy, kx, ky, irow;
    int_t i, j;
    int notran;

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0 )
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_dgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if (A->nrow == 0 || A->ncol == 0 || (alpha == 0. && beta == 1.))
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if (strncmp(trans, "N", 1)==0) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if (beta != 1.) {
	if (incy == 1) {
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) y[i] = 0.;
	    else
		for (i = 0; i < leny; ++i) y[i] = beta * y[i];
	} else {
	    iy = ky;
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) {
		    y[iy] = 0.;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    y[iy] = beta * y[iy];
		    iy += incy;
		}
	}
    }
    
    if (alpha == 0.) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if (x[jx] != 0.) {
		    temp = alpha * x[jx];
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			y[irow] += temp * Aval[i];
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp += Aval[i] * x[irow];
		}
		y[jy] += alpha * temp;
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;
}